

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ArgMinLayerParams * __thiscall
CoreML::Specification::ArgMinLayerParams::New(ArgMinLayerParams *this,Arena *arena)

{
  ArgMinLayerParams *this_00;
  
  this_00 = (ArgMinLayerParams *)operator_new(0x20);
  ArgMinLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ArgMinLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ArgMinLayerParams* ArgMinLayerParams::New(::google::protobuf::Arena* arena) const {
  ArgMinLayerParams* n = new ArgMinLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}